

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void curses_display_buffer(char *inbuf,nh_bool trymove)

{
  char *__ptr;
  char *pcVar1;
  char *pcVar2;
  nh_menuitem *pnVar3;
  nh_menuitem *_item_;
  nh_menuitem *items;
  wchar_t size;
  wchar_t icount;
  char linebuf [256];
  char *buf;
  char *line_end;
  char *line;
  nh_bool trymove_local;
  char *inbuf_local;
  
  __ptr = strdup(inbuf);
  items._4_4_ = L'\0';
  items._0_4_ = L'\n';
  _item_ = (nh_menuitem *)malloc(0xa78);
  line_end = __ptr;
  while (*line_end != '\0') {
    pcVar1 = strchr(line_end,10);
    if (pcVar1 != (char *)0x0) {
      if ((line_end < pcVar1) && (pcVar1[-1] == '\r')) {
        pcVar1[-1] = '\0';
      }
      *pcVar1 = '\0';
    }
    strncpy((char *)&size,line_end,0x100);
    linebuf[0xf7] = '\0';
    pcVar2 = strchr((char *)&size,9);
    if (pcVar2 != (char *)0x0) {
      tabexpand((char *)&size);
    }
    if ((wchar_t)items <= items._4_4_) {
      items._0_4_ = (wchar_t)items << 1;
      _item_ = (nh_menuitem *)realloc(_item_,(long)(wchar_t)items * 0x10c);
    }
    pnVar3 = _item_ + items._4_4_;
    pnVar3->id = 0;
    pnVar3->role = MI_TEXT;
    pnVar3->accel = '\0';
    pnVar3->group_accel = '\0';
    pnVar3->selected = '\0';
    strcpy(pnVar3->caption,(char *)&size);
    items._4_4_ = items._4_4_ + L'\x01';
    if (pcVar1 == (char *)0x0) {
      line_end = strchr(line_end,0);
    }
    else {
      line_end = pcVar1 + 1;
    }
  }
  curses_display_menu((nh_menuitem_conflict *)_item_,items._4_4_,(char *)0x0,L'\0',(wchar_t *)0x0);
  free(_item_);
  free(__ptr);
  return;
}

Assistant:

void curses_display_buffer(const char *inbuf, nh_bool trymove)
{
    char *line, *line_end, *buf;
    char linebuf[BUFSZ];
    int icount, size;
    struct nh_menuitem *items;

    buf = strdup(inbuf);
    icount = 0;
    size = 10;
    items = malloc(size * sizeof(struct nh_menuitem));

    line = buf;
    while (*line) {
	line_end = strchr(line, '\n');
	if (line_end) {
	    /* deal with the CR that Windows adds to the LF */
	    if (line_end > line && *(line_end - 1) == '\r')
		*(line_end - 1) = '\0';
	    *line_end = '\0';
	}

	strncpy(linebuf, line, BUFSZ);
	linebuf[BUFSZ - 1] = '\0';
	if (strchr(linebuf, '\t') != 0)
	    tabexpand(linebuf);
	add_menu_txt(items, size, icount, linebuf, MI_TEXT);

	if (line_end) {
	    line = line_end + 1;
	} else {
	    /* null terminator guaranteed if earlier strdup() succeeded */
	    line = strchr(line, '\0');
	}
    }

    curses_display_menu(items, icount, NULL, PICK_NONE, NULL);
    free(items);
    free(buf);
}